

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffgkyc(fitsfile *fptr,char *keyname,float *value,char *comm,int *status)

{
  int iVar1;
  size_t sVar2;
  char valstring [71];
  char message [81];
  char local_d8 [80];
  char local_88 [96];
  
  if (0 < *status) {
    return *status;
  }
  ffgkey(fptr,keyname,local_d8,comm,status);
  if (local_d8[0] == '(') {
    local_d8[0] = ' ';
    sVar2 = strcspn(local_d8,")");
    local_d8[(int)sVar2] = '\0';
    sVar2 = strcspn(local_d8,",");
    local_d8[(int)sVar2] = '\0';
    ffc2r(local_d8,value,status);
    ffc2r(local_d8 + ((int)sVar2 + 1),value + 1,status);
    iVar1 = *status;
  }
  else {
    snprintf(local_88,0x51,"keyword %s does not have a complex value (ffgkyc):",keyname);
    ffpmsg(local_88);
    ffpmsg(local_d8);
    *status = 0x198;
    iVar1 = 0x198;
  }
  return iVar1;
}

Assistant:

int ffgkyc( fitsfile *fptr,     /* I - FITS file pointer         */
            const char  *keyname,     /* I - name of keyword to read   */
            float *value,       /* O - keyword value (real,imag) */
            char  *comm,        /* O - keyword comment           */
            int   *status)      /* IO - error status             */
/*
  Read (get) the named keyword, returning the value and comment.
  The keyword must have a complex value. No implicit data conversion
  will be performed.
*/
{
    char valstring[FLEN_VALUE], message[FLEN_ERRMSG];
    int len;

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */

    if (valstring[0] != '(' )   /* test that this is a complex keyword */
    {
      snprintf(message, FLEN_ERRMSG, "keyword %s does not have a complex value (ffgkyc):",
              keyname);
      ffpmsg(message);
      ffpmsg(valstring);
      return(*status = BAD_C2F);
    }

    valstring[0] = ' ';            /* delete the opening parenthesis */
    len = strcspn(valstring, ")" );  
    valstring[len] = '\0';         /* delete the closing parenthesis */

    len = strcspn(valstring, ",");
    valstring[len] = '\0';

    ffc2r(valstring, &value[0], status);       /* convert the real part */
    ffc2r(&valstring[len + 1], &value[1], status); /* convert imag. part */
    return(*status);
}